

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ast::RandCaseStatement::Item>::
emplace_back<slang::ast::RandCaseStatement::Item>
          (SmallVectorBase<slang::ast::RandCaseStatement::Item> *this,Item *args)

{
  size_type sVar1;
  ulong uVar2;
  undefined8 *puVar3;
  Statement *pSVar4;
  pointer pIVar5;
  pointer pIVar6;
  pointer pIVar7;
  pointer pIVar8;
  EVP_PKEY_CTX *pEVar9;
  EVP_PKEY_CTX *ctx;
  long lVar10;
  pointer pIVar11;
  
  pIVar11 = this->data_ + this->len;
  if (this->len != this->cap) {
    pSVar4 = (args->stmt).ptr;
    (pIVar11->expr).ptr = (args->expr).ptr;
    (pIVar11->stmt).ptr = pSVar4;
    sVar1 = this->len;
    this->len = sVar1 + 1;
    return this->data_ + sVar1;
  }
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar9 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar2 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar2 * 2);
  if (pEVar9 < ctx) {
    pEVar9 = ctx;
  }
  if (0x7ffffffffffffff - uVar2 < uVar2) {
    pEVar9 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar10 = (long)pIVar11 - (long)this->data_;
  pIVar5 = (pointer)operator_new((long)pEVar9 << 4);
  pSVar4 = (args->stmt).ptr;
  *(undefined8 *)((long)pIVar5 + lVar10) = (args->expr).ptr;
  ((undefined8 *)((long)pIVar5 + lVar10))[1] = pSVar4;
  pIVar8 = this->data_;
  pIVar6 = pIVar8 + this->len;
  pIVar7 = pIVar5;
  if (pIVar6 == pIVar11) {
    for (; pIVar8 != pIVar11; pIVar8 = pIVar8 + 1) {
      pSVar4 = (pIVar8->stmt).ptr;
      (pIVar7->expr).ptr = (pIVar8->expr).ptr;
      (pIVar7->stmt).ptr = pSVar4;
      pIVar7 = pIVar7 + 1;
    }
  }
  else {
    for (; pIVar8 != pIVar11; pIVar8 = pIVar8 + 1) {
      pSVar4 = (pIVar8->stmt).ptr;
      (pIVar7->expr).ptr = (pIVar8->expr).ptr;
      (pIVar7->stmt).ptr = pSVar4;
      pIVar7 = pIVar7 + 1;
    }
    puVar3 = (undefined8 *)(lVar10 + (long)pIVar5);
    for (; pIVar11 != pIVar6; pIVar11 = pIVar11 + 1) {
      pSVar4 = (pIVar11->stmt).ptr;
      puVar3[2] = (pIVar11->expr).ptr;
      puVar3[3] = pSVar4;
      puVar3 = puVar3 + 2;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar9;
  this->data_ = pIVar5;
  return (reference)((long)pIVar5 + lVar10);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }